

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.h
# Opt level: O1

void __thiscall jaegertracing::Tracer::~Tracer(Tracer *this)

{
  _Atomic_word *p_Var1;
  RestrictionManager *pRVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  int iVar5;
  
  (this->super_Tracer)._vptr_Tracer = (_func_int **)&PTR__Tracer_00266920;
  Close(this);
  pRVar2 = (this->_restrictionManager)._M_t.
           super___uniq_ptr_impl<jaegertracing::baggage::RestrictionManager,_std::default_delete<jaegertracing::baggage::RestrictionManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_jaegertracing::baggage::RestrictionManager_*,_std::default_delete<jaegertracing::baggage::RestrictionManager>_>
           .super__Head_base<0UL,_jaegertracing::baggage::RestrictionManager_*,_false>._M_head_impl;
  if (pRVar2 != (RestrictionManager *)0x0) {
    (*pRVar2->_vptr_RestrictionManager[1])();
  }
  (this->_restrictionManager)._M_t.
  super___uniq_ptr_impl<jaegertracing::baggage::RestrictionManager,_std::default_delete<jaegertracing::baggage::RestrictionManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_jaegertracing::baggage::RestrictionManager_*,_std::default_delete<jaegertracing::baggage::RestrictionManager>_>
  .super__Head_base<0UL,_jaegertracing::baggage::RestrictionManager_*,_false>._M_head_impl =
       (RestrictionManager *)0x0;
  std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&this->_tags);
  (this->_binaryPropagator).super_Extractor<std::basic_istream<char,_std::char_traits<char>_>_&>.
  _vptr_Extractor = (_func_int **)&PTR__BinaryPropagator_00266dd8;
  (this->_binaryPropagator).super_Injector<std::basic_ostream<char,_std::char_traits<char>_>_&>.
  _vptr_Injector = (_func_int **)&PTR__BinaryPropagator_00266e08;
  p_Var3 = (this->_binaryPropagator)._metrics.
           super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  propagation::
  Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
  ::~Propagator(&(this->_httpHeaderPropagator).
                 super_Propagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
               );
  propagation::
  Propagator<const_opentracing::v3::TextMapReader_&,_const_opentracing::v3::TextMapWriter_&>::
  ~Propagator(&this->_textPropagator);
  p_Var3 = (this->_logger).
           super___shared_ptr<jaegertracing::logging::Logger,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->_metrics).
           super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->_reporter).
           super___shared_ptr<jaegertracing::reporters::Reporter,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  p_Var3 = (this->_sampler).
           super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pcVar4 = (this->_serviceName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &(this->_serviceName).field_2) {
    operator_delete(pcVar4);
  }
  p_Var3 = (this->super_enable_shared_from_this<jaegertracing::Tracer>)._M_weak_this.
           super___weak_ptr<jaegertracing::Tracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

~Tracer() { Close(); }